

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O0

int nv_ckbios(uint8_t *data)

{
  ushort uVar1;
  uint length;
  int iVar2;
  int vbios2_len;
  int vbios_len;
  uint32_t ret;
  uint16_t pcir_ptr2;
  uint16_t pcir_ptr;
  uint8_t *data_local;
  
  data_local._4_4_ = nv_checksignature(data);
  if (data_local._4_4_ == 1) {
    uVar1 = *(ushort *)(data + 0x18);
    length = (uint)data[(int)(uVar1 + 0x10)] * 0x200 + (uint)data[(int)(uVar1 + 0x11)] * 0x20000;
    vbios2_len = nv_cksum(data,length);
    if ((data[(int)(uVar1 + 0x15)] & 0x80) == 0) {
      fprintf(_stderr,"Card has second bios\n");
      iVar2 = nv_checksignature(data + (int)length);
      if (iVar2 != 1) {
        return iVar2;
      }
      vbios2_len = nv_cksum(data + (int)length,
                            (uint)data[(int)(length + CONCAT11(data[(int)(length + 0x19)],
                                                               data[(int)(length + 0x18)]) + 0x10)]
                            * 0x200 + (uint)data[(int)(length + CONCAT11(data[(int)(length + 0x19)],
                                                                         data[(int)(length + 0x18)])
                                                      + 0x11)] * 0x20000);
    }
    data_local._4_4_ = vbios2_len;
  }
  return data_local._4_4_;
}

Assistant:

static int nv_ckbios(const uint8_t *data)
{
	uint16_t pcir_ptr, pcir_ptr2;
	uint32_t ret = EUNK;
	int vbios_len, vbios2_len;

	ret = nv_checksignature(data);
	if (ret != EOK)
		return ret;

	pcir_ptr = data[0x18] | data[0x19] << 8;
	vbios_len = data[pcir_ptr + 0x10] * 512 + data[pcir_ptr + 0x11] * 512 * 256;
	ret = nv_cksum(data, vbios_len);

	/* Check for a second vbios */
	if (!(data[pcir_ptr + 0x15] & 0x80)) {

		fprintf(stderr, "Card has second bios\n");

		ret = nv_checksignature(data + vbios_len);
		if (ret != EOK)
			return ret;

		pcir_ptr2 = data[vbios_len + 0x18] | data[vbios_len + 0x19] << 8;
		vbios2_len = data[vbios_len + pcir_ptr2 + 0x10] * 512 + data[vbios_len + pcir_ptr2 + 0x11] * 512 * 256;

		ret = nv_cksum(data + vbios_len, vbios2_len);
	}
	return ret;
}